

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O3

void Gia_ManTestDoms2(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  undefined1 *puVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  Vec_Int_t *vSupp;
  int *__ptr;
  Vec_Int_t *pVVar7;
  long lVar8;
  ulong uVar9;
  int level;
  long lVar10;
  timespec ts;
  timespec local_40;
  
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (p->vDoms != (Vec_Int_t *)0x0) {
    __assert_fail("p->vDoms == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                  ,0xc4,"void Gia_ManTestDoms2(Gia_Man_t *)");
  }
  Gia_ManComputeDoms(p);
  level = 3;
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar10 + lVar8) / 1000000.0);
  Gia_ManCleanMark1(p);
  pVVar7 = p->vCis;
  uVar9 = (ulong)(uint)pVVar7->nSize;
  if (p->nRegs < pVVar7->nSize) {
    lVar8 = 0;
    do {
      if ((int)uVar9 <= lVar8) goto LAB_00624ae8;
      iVar6 = pVVar7->pArray[lVar8];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00624ac9;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar2 = &p->pObjs[iVar6].field_0x7;
      *puVar2 = *puVar2 | 0x40;
      lVar8 = lVar8 + 1;
      pVVar7 = p->vCis;
      uVar9 = (ulong)pVVar7->nSize;
    } while (lVar8 < (long)(uVar9 - (long)p->nRegs));
  }
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  __ptr = (int *)malloc(400);
  vSupp->pArray = __ptr;
  Gia_ManCreateRefs(p);
  pVVar7 = p->vCis;
  uVar9 = (ulong)(uint)pVVar7->nSize;
  if (p->nRegs < pVVar7->nSize) {
    lVar8 = 0;
LAB_00624944:
    if ((int)uVar9 <= lVar8) {
LAB_00624ae8:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar3 = pVVar7->pArray[lVar8];
    lVar10 = (long)(int)uVar3;
    if ((lVar10 < 0) || (p->nObjs <= (int)uVar3)) {
LAB_00624ac9:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar5 = p->pObjs;
    if (pGVar5 != (Gia_Obj_t *)0x0) {
      if (p->vDoms->nSize <= (int)uVar3) goto LAB_00624ae8;
      uVar4 = p->vDoms->pArray[lVar10];
      if (uVar3 != uVar4) {
        if (((int)uVar4 < 0) || ((uint)p->nObjs <= uVar4)) goto LAB_00624ac9;
        pGVar1 = pGVar5 + lVar10;
        pGVar5 = pGVar5 + uVar4;
        iVar6 = (int)*(ulong *)pGVar5;
        uVar9 = *(ulong *)pGVar5 & 0x1fffffff;
        if (uVar9 == 0x1fffffff || -1 < iVar6) {
          if ((iVar6 < 0) || ((int)uVar9 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pDom)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                          ,0xdd,"void Gia_ManTestDoms2(Gia_Man_t *)");
          }
          Abs_GiaObjDeref_rec(p,pGVar5);
          Abs_ManSupport2(p,pGVar5,vSupp);
          Abs_GiaObjRef_rec(p,pGVar5);
          pGVar5 = p->pObjs;
          if ((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (0 < (long)vSupp->nSize) {
            lVar10 = 0;
            do {
              if (vSupp->pArray[lVar10] ==
                  (int)((ulong)((long)pGVar1 - (long)pGVar5) >> 2) * -0x55555555) goto LAB_00624a7b;
              lVar10 = lVar10 + 1;
            } while (vSupp->nSize != lVar10);
          }
          puts("FAILURE.");
        }
        else if (pGVar5 + -uVar9 != pGVar1) {
          __assert_fail("Gia_ObjFanin0(pDom) == pObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                        ,0xda,"void Gia_ManTestDoms2(Gia_Man_t *)");
        }
      }
LAB_00624a7b:
      lVar8 = lVar8 + 1;
      pVVar7 = p->vCis;
      uVar9 = (ulong)pVVar7->nSize;
      if (lVar8 < (long)(uVar9 - (long)p->nRegs)) goto LAB_00624944;
    }
    __ptr = vSupp->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(vSupp);
  Gia_ManCleanMark1(p);
  return;
}

Assistant:

void Gia_ManTestDoms2( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj, * pDom;
    abctime clk = Abc_Clock();
    int i;
    assert( p->vDoms == NULL );
    Gia_ManComputeDoms( p );
/*
    Gia_ManForEachPi( p, pObj, i )
        if ( Gia_ObjId(p, pObj) != Gia_ObjDom(p, pObj) )
            printf( "PI =%6d  Id =%8d. Dom =%8d.\n", i, Gia_ObjId(p, pObj), Gia_ObjDom(p, pObj) );
*/
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // for each dominated PI, when if the PIs is in a leaf of the MFFC of the dominator
    Gia_ManCleanMark1( p );
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark1 = 1;
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
    {
        if ( Gia_ObjId(p, pObj) == Gia_ObjDom(p, pObj) )
            continue;

        pDom = Gia_ManObj(p, Gia_ObjDom(p, pObj));
        if ( Gia_ObjIsCo(pDom) )
        {
            assert( Gia_ObjFanin0(pDom) == pObj );
            continue;
        }
        assert( Gia_ObjIsAnd(pDom) );
        Abs_GiaObjDeref_rec( p, pDom );
        Abs_ManSupport2( p, pDom, vNodes );
        Abs_GiaObjRef_rec( p, pDom );

        if ( Vec_IntFind(vNodes, Gia_ObjId(p, pObj)) == -1 )
            printf( "FAILURE.\n" );
//        else
//            printf( "Success.\n" );
    }
    Vec_IntFree( vNodes );
    Gia_ManCleanMark1( p );
}